

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlog.cpp
# Opt level: O0

void vm_log(char *str,size_t len)

{
  tm *__tp;
  char *__s;
  size_t sVar1;
  CVmFileSource *__s_00;
  ulong in_RSI;
  undefined8 in_RDI;
  size_t msglen;
  char *msg;
  size_t tmsgl;
  char *tmsg;
  tm *tblk;
  time_t timer;
  CVmFileSource ds;
  osfildef *fp;
  size_t in_stack_000000b0;
  char *in_stack_000000b8;
  CVmDataSource *in_stack_000000c0;
  CCharmapToLocal *in_stack_000000c8;
  undefined4 in_stack_ffffffffffffff88;
  os_filetype_t in_stack_ffffffffffffff8c;
  CVmFileSource *in_stack_ffffffffffffff90;
  CVmFileSource *this;
  time_t local_30 [3];
  FILE *local_18;
  ulong local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = (FILE *)osfoprwt((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  if (local_18 != (FILE *)0x0) {
    CVmFileSource::CVmFileSource
              (in_stack_ffffffffffffff90,
               (osfildef *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_30[0] = time((time_t *)0x0);
    __tp = localtime(local_30);
    __s = asctime(__tp);
    sVar1 = strlen(__s);
    if ((sVar1 != 0) && (__s[sVar1 - 1] == '\n')) {
      __s[sVar1 - 1] = '\0';
    }
    __s_00 = (CVmFileSource *)t3sprintf_alloc("[%s] %.*s\n",__s,local_10 & 0xffffffff,local_8);
    this = __s_00;
    sVar1 = strlen((char *)__s_00);
    CVmFileSource::seek(this,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
    if (G_cmap_to_log_X == (CCharmapToLocal *)0x0) {
      fwrite(__s_00,sVar1,1,local_18);
    }
    else {
      CCharmapToLocal::write_file
                (in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
    }
    free(__s_00);
    CVmFileSource::~CVmFileSource(this);
  }
  return;
}

Assistant:

void vm_log(VMG_ const char *str, size_t len)
{
    /* open the system log file */
    osfildef *fp = osfoprwt(G_syslogfile, OSFTTEXT);
    if (fp != 0)
    {
        /* wrap it in a data source */
        CVmFileSource ds(fp);

        /* get a printable timestamp */
        os_time_t timer = os_time(0);
        struct tm *tblk = os_localtime(&timer);
        char *tmsg = asctime(tblk);

        /* remove the trailing '\n' from the asctime message */
        size_t tmsgl = strlen(tmsg);
        if (tmsgl > 0 && tmsg[tmsgl-1] == '\n')
            tmsg[--tmsgl] = '\0';

        /* build the full message: [<timestamp>] <message> <newline> */
        char *msg = t3sprintf_alloc("[%s] %.*s\n", tmsg, (int)len, str);
        size_t msglen = strlen(msg);

        /* seek to the end of the file */
        ds.seek(0, OSFSK_END);

        /* if we can convert to a local character set, do so */
        if (G_cmap_to_log != 0)
        {
            /* write the message in the local character set */
            G_cmap_to_file->write_file(&ds, msg, msglen);
        }
        else
        {
            /* write the message with no character set conversion */
            (void)osfwb(fp, msg, msglen);
        }

        /* done with the formatted text string */
        t3free(msg);
    }
}